

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O2

void __thiscall slang::ast::TypePrinter::append(TypePrinter *this,Type *type)

{
  FormatBuffer *this_00;
  char *begin;
  Scope *in_RDX;
  Scope *extraout_RDX;
  string local_40;
  
  if ((this->options).addSingleQuotes == true) {
    ::fmt::v11::detail::buffer<char>::append<char>
              ((buffer<char> *)
               (this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,"\'","");
    in_RDX = extraout_RDX;
  }
  if (((this->options).printAKA == true) && ((type->super_Symbol).kind == TypeAlias)) {
    if ((this->options).elideScopeNames == false) {
      this_00 = (this->buffer)._M_t.
                super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
                ._M_t.
                super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
                .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl;
      getLexicalPath_abi_cxx11_(&local_40,(ast *)(type->super_Symbol).parentScope,in_RDX);
      ::fmt::v11::detail::buffer<char>::append<char>
                ((buffer<char> *)this_00,local_40._M_dataplus._M_p,
                 (char *)(local_40._M_string_length + (long)local_40._M_dataplus._M_p));
      std::__cxx11::string::~string((string *)&local_40);
    }
    begin = (type->super_Symbol).name._M_str;
    ::fmt::v11::detail::buffer<char>::append<char>
              ((buffer<char> *)
               (this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,begin,
               begin + (type->super_Symbol).name._M_len);
  }
  else {
    local_40._M_dataplus._M_p = (char *)0x0;
    local_40._M_string_length = 0x484ac0;
    Symbol::visit<slang::ast::TypePrinter&,std::basic_string_view<char,std::char_traits<char>>>
              (&type->super_Symbol,this,
               (basic_string_view<char,_std::char_traits<char>_> *)&local_40);
  }
  if ((this->options).addSingleQuotes == true) {
    ::fmt::v11::detail::buffer<char>::append<char>
              ((buffer<char> *)
               (this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,"\'","");
  }
  if (((this->options).printAKA == true) && ((type->super_Symbol).kind == TypeAlias)) {
    printAKA(this,type);
  }
  return;
}

Assistant:

void TypePrinter::append(const Type& type) {
    if (options.addSingleQuotes)
        buffer->append("'");

    if (options.printAKA && type.kind == SymbolKind::TypeAlias) {
        if (!options.elideScopeNames)
            buffer->append(getLexicalPath(type.getParentScope()));
        buffer->append(type.name);
    }
    else {
        type.visit(*this, ""sv);
    }

    if (options.addSingleQuotes)
        buffer->append("'");

    if (options.printAKA && type.kind == SymbolKind::TypeAlias)
        printAKA(type);
}